

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# squeeze.cpp
# Opt level: O1

int __thiscall ncnn::Squeeze::load_param(Squeeze *this,ParamDict *pd)

{
  int *piVar1;
  void *__ptr;
  Allocator *pAVar2;
  int iVar3;
  Mat local_b8;
  Mat local_68;
  
  iVar3 = ParamDict::get(pd,0,0);
  this->squeeze_w = iVar3;
  iVar3 = ParamDict::get(pd,1,0);
  this->squeeze_h = iVar3;
  iVar3 = ParamDict::get(pd,0xb,0);
  this->squeeze_d = iVar3;
  iVar3 = ParamDict::get(pd,2,0);
  this->squeeze_c = iVar3;
  local_68.cstep = 0;
  local_68.data = (void *)0x0;
  local_68.refcount._0_4_ = 0;
  local_68.refcount._4_4_ = 0;
  local_68.elemsize._0_4_ = 0;
  local_68._20_8_ = 0;
  local_68.allocator = (Allocator *)0x0;
  local_68.dims = 0;
  local_68.w = 0;
  local_68.h = 0;
  local_68.d = 0;
  local_68.c = 0;
  ParamDict::get(&local_b8,pd,3,&local_68);
  if (&this->axes != &local_b8) {
    piVar1 = (int *)CONCAT44(local_b8.refcount._4_4_,local_b8.refcount._0_4_);
    if (piVar1 != (int *)0x0) {
      LOCK();
      *piVar1 = *piVar1 + 1;
      UNLOCK();
    }
    piVar1 = (this->axes).refcount;
    if (piVar1 != (int *)0x0) {
      LOCK();
      *piVar1 = *piVar1 + -1;
      UNLOCK();
      if (*piVar1 == 0) {
        __ptr = (this->axes).data;
        pAVar2 = (this->axes).allocator;
        if (pAVar2 == (Allocator *)0x0) {
          if (__ptr != (void *)0x0) {
            free(__ptr);
          }
        }
        else {
          (**(code **)(*(long *)pAVar2 + 0x18))();
        }
      }
    }
    (this->axes).cstep = 0;
    *(undefined8 *)((long)&(this->axes).refcount + 4) = 0;
    *(undefined8 *)((long)&(this->axes).elemsize + 4) = 0;
    (this->axes).data = (void *)0x0;
    (this->axes).refcount = (int *)0x0;
    (this->axes).dims = 0;
    (this->axes).w = 0;
    (this->axes).h = 0;
    (this->axes).d = 0;
    (this->axes).c = 0;
    (this->axes).data = local_b8.data;
    (this->axes).refcount = (int *)CONCAT44(local_b8.refcount._4_4_,local_b8.refcount._0_4_);
    (this->axes).elemsize = CONCAT44(local_b8.elemsize._4_4_,(undefined4)local_b8.elemsize);
    (this->axes).elempack = local_b8.elempack;
    (this->axes).allocator = local_b8.allocator;
    (this->axes).dims = local_b8.dims;
    (this->axes).w = local_b8.w;
    (this->axes).h = local_b8.h;
    (this->axes).d = local_b8.d;
    (this->axes).c = local_b8.c;
    (this->axes).cstep = local_b8.cstep;
  }
  piVar1 = (int *)CONCAT44(local_b8.refcount._4_4_,local_b8.refcount._0_4_);
  if (piVar1 != (int *)0x0) {
    LOCK();
    *piVar1 = *piVar1 + -1;
    UNLOCK();
    if (*piVar1 == 0) {
      if (local_b8.allocator == (Allocator *)0x0) {
        if (local_b8.data != (void *)0x0) {
          free(local_b8.data);
        }
      }
      else {
        (**(code **)(*(long *)local_b8.allocator + 0x18))();
      }
    }
  }
  local_b8.cstep = 0;
  local_b8.data = (void *)0x0;
  local_b8.refcount._0_4_ = 0;
  local_b8.refcount._4_4_ = 0;
  local_b8.elemsize._0_4_ = 0;
  local_b8.elemsize._4_4_ = 0;
  local_b8.elempack = 0;
  local_b8.dims = 0;
  local_b8.w = 0;
  local_b8.h = 0;
  local_b8.d = 0;
  local_b8.c = 0;
  piVar1 = (int *)CONCAT44(local_68.refcount._4_4_,local_68.refcount._0_4_);
  if (piVar1 != (int *)0x0) {
    LOCK();
    *piVar1 = *piVar1 + -1;
    UNLOCK();
    if (*piVar1 == 0) {
      if (local_68.allocator == (Allocator *)0x0) {
        if (local_68.data != (void *)0x0) {
          free(local_68.data);
        }
      }
      else {
        (**(code **)(*(long *)local_68.allocator + 0x18))();
      }
    }
  }
  return 0;
}

Assistant:

int Squeeze::load_param(const ParamDict& pd)
{
    squeeze_w = pd.get(0, 0);
    squeeze_h = pd.get(1, 0);
    squeeze_d = pd.get(11, 0);
    squeeze_c = pd.get(2, 0);
    axes = pd.get(3, Mat());

    return 0;
}